

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * kratos::fs::which(string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  undefined1 path1 [8];
  undefined1 local_88 [8];
  string env_path;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  
  local_88 = (undefined1  [8])&env_path._M_string_length;
  env_path._M_dataplus._M_p = (pointer)0x0;
  env_path._M_string_length._0_1_ = 0;
  getenv("PATH");
  std::__cxx11::string::assign(local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(env_path.field_2._M_local_buf + 8),";:",
             (allocator<char> *)
             ((long)&tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48,(string *)local_88,(string *)((long)&env_path.field_2 + 8));
  std::__cxx11::string::~string((string *)(env_path.field_2._M_local_buf + 8));
  for (path1 = local_48;
      path1 != (undefined1  [8])
               tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      path1 = (undefined1  [8])((long)path1 + 0x20)) {
    join(__return_storage_ptr__,(string *)path1,name);
    bVar1 = exists(__return_storage_ptr__);
    if (bVar1) goto LAB_001b5ba9;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",
             (allocator<char> *)(env_path.field_2._M_local_buf + 8));
LAB_001b5ba9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string which(const std::string &name) {
    // windows is more picky
    std::string env_path;
#ifdef _WIN32
    char *path_var;
    size_t len;
    auto err = _dupenv_s(&path_var, &len, "PATH");
    if (err) {
        env_path = "";
    }
    env_path = std::string(path_var);
    free(path_var);
    path_var = nullptr;
#else
    env_path = std::getenv("PATH");
#endif
    // tokenize it base on either : or ;
    auto tokens = string::get_tokens(env_path, ";:");
    for (auto const &dir : tokens) {
        auto new_path = fs::join(dir, name);
        if (exists(new_path)) {
            return new_path;
        }
    }
    return "";
}